

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_image_flag_t flag)

{
  uint in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  allocator local_16;
  undefined1 local_15;
  uint local_14;
  string *psStack_10;
  ze_image_flag_t flag_local;
  string *flags;
  
  this = (string *)CONCAT44(in_register_0000003c,flag);
  local_15 = 0;
  local_14 = in_ESI;
  psStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"",&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  if ((local_14 & 1) != 0) {
    std::__cxx11::string::append((char *)this);
  }
  if ((local_14 & 2) != 0) {
    std::__cxx11::string::append((char *)this);
  }
  return this;
}

Assistant:

std::string to_string(const ze_image_flag_t flag) {
  std::string flags = "";
  if (flag & ZE_IMAGE_FLAG_KERNEL_WRITE) {
    flags.append("|ZE_IMAGE_FLAG_KERNEL_WRITE|");
  }
  if (flag & ZE_IMAGE_FLAG_BIAS_UNCACHED) {
    flags.append("|ZE_IMAGE_FLAG_BIAS_UNCACHED|");
  }

  return flags;
}